

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O2

void __thiscall
gmath::EquidistantDistortion::getProperties(EquidistantDistortion *this,Properties *prop,int id)

{
  int in_ECX;
  undefined4 in_register_00000014;
  string local_40;
  
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"e1",(char *)CONCAT44(in_register_00000014,id),
             in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->ed);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"e2",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->ed + 1);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"e3",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->ed + 2);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"e4",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->ed + 3);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void EquidistantDistortion::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("e1", id).c_str(), ed[0]);
  prop.putValue(getCameraKey("e2", id).c_str(), ed[1]);
  prop.putValue(getCameraKey("e3", id).c_str(), ed[2]);
  prop.putValue(getCameraKey("e4", id).c_str(), ed[3]);
}